

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAnalytic_mels.c
# Opt level: O0

void analytical_solution(sunrealtype t,N_Vector y,N_Vector yp)

{
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  
  dVar1 = exp(in_XMM0_Qa);
  **(double **)(*in_RDI + 0x10) = dVar1;
  dVar1 = exp(in_XMM0_Qa);
  *(double *)(*(long *)(*in_RDI + 0x10) + 8) = dVar1 / (in_XMM0_Qa - 2.0);
  dVar1 = exp(in_XMM0_Qa);
  **(double **)(*in_RSI + 0x10) = dVar1;
  dVar1 = exp(in_XMM0_Qa);
  dVar2 = exp(in_XMM0_Qa);
  *(double *)(*(long *)(*in_RSI + 0x10) + 8) =
       dVar1 / (in_XMM0_Qa - 2.0) - (dVar2 / (in_XMM0_Qa - 2.0)) / (in_XMM0_Qa - 2.0);
  return;
}

Assistant:

static void analytical_solution(sunrealtype t, N_Vector y, N_Vector yp)
{
  NV_Ith_S(y, 0)  = SUNRexp(t);
  NV_Ith_S(y, 1)  = SUNRexp(t) / (t - SUN_RCONST(2.0));
  NV_Ith_S(yp, 0) = SUNRexp(t);
  NV_Ith_S(yp, 1) = SUNRexp(t) / (t - SUN_RCONST(2.0)) -
                    SUNRexp(t) / (t - SUN_RCONST(2.0)) / (t - SUN_RCONST(2.0));
}